

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# er.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  size_t sVar6;
  time_t tVar7;
  ostream *poVar8;
  undefined8 extraout_RAX;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  ostream *this;
  double dVar12;
  ofstream file_stream;
  float local_258;
  allocator local_251;
  double local_250;
  ulong local_248;
  char *local_240;
  ulong local_238;
  long *local_230;
  filebuf local_228 [8];
  long local_220 [2];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  uVar10 = 0;
  if (argc < 1) {
    local_258 = 1.0;
    iVar9 = -1;
    local_238 = 0;
    pcVar11 = (char *)0x0;
  }
  else {
    local_250 = (double)CONCAT44(local_250._4_4_,0xffffffff);
    local_258 = 1.0;
    local_240 = (char *)0x0;
    local_238 = 0;
    local_248 = 0;
    do {
      iVar9 = (int)uVar10;
      std::__cxx11::string::string((string *)&local_230,argv[iVar9],&local_251);
      iVar2 = std::__cxx11::string::compare((char *)&local_230);
      if (iVar2 == 0) {
        print_usage_and_exit(0);
        goto LAB_001029c8;
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_230);
      if (iVar2 == 0) {
        dVar12 = atof(argv[(long)iVar9 + 1]);
        local_258 = (float)dVar12;
        iVar9 = iVar9 + 1;
        pcVar11 = local_240;
      }
      else {
        uVar5 = std::__cxx11::string::compare((char *)&local_230);
        if ((int)uVar5 == 0) {
          local_248 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
          pcVar11 = local_240;
        }
        else {
          uVar5 = std::__cxx11::string::compare((char *)&local_230);
          if ((int)uVar5 == 0) {
            local_238 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            pcVar11 = local_240;
          }
          else {
            pcVar11 = argv[iVar9];
            if (local_250._0_4_ < 0) {
              iVar2 = atoi(argv[iVar9]);
              local_250 = (double)CONCAT44(local_250._4_4_,iVar2);
              pcVar11 = local_240;
            }
          }
        }
      }
      local_240 = pcVar11;
      if (local_230 != local_220) {
        operator_delete(local_230,local_220[0] + 1);
      }
      uVar10 = (ulong)(iVar9 + 1U);
    } while ((int)(iVar9 + 1U) < argc);
    uVar10 = local_248;
    pcVar11 = local_240;
    iVar9 = local_250._0_4_;
  }
  if (iVar9 != -1) {
    this = (ostream *)&local_230;
    std::ofstream::ofstream(this,pcVar11,_S_out);
    if (pcVar11 == (char *)0x0) {
      this = (ostream *)&std::cout;
    }
    else if ((abStack_210[local_230[-3]] & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"couldn\'t open file ",0x13);
      sVar6 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,sVar6);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(-1);
    }
    tVar7 = time((time_t *)0x0);
    srand((uint)tVar7);
    std::__ostream_insert<char,std::char_traits<char>>(this,"dim 0",5);
    cVar1 = (char)this;
    std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    iVar2 = iVar9;
    if (0 < iVar9) {
      do {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)this,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(this,"dim 1",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    local_240 = pcVar11;
    if (0 < iVar9) {
      local_250 = (double)local_258;
      iVar2 = 0;
      do {
        iVar3 = iVar2 + 1;
        local_248 = CONCAT44(local_248._4_4_,iVar3);
        if (iVar3 < iVar9) {
          do {
            if (((local_258 == 1.0) && (!NAN(local_258))) ||
               (iVar4 = rand(), (double)(iVar4 % 1000) / 1000.0 < local_250)) {
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)this,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              std::ostream::operator<<((ostream *)poVar8,iVar3);
              if ((uVar10 & 1) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
                iVar4 = rand();
                std::ostream::_M_insert<double>((double)(iVar4 % 100) / 100.0 + 1.0);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
              std::ostream::put(cVar1);
              std::ostream::flush();
            }
            if (((local_238 & 1) == 0) &&
               (((local_258 == 1.0 && (!NAN(local_258))) ||
                (iVar4 = rand(), (double)(iVar4 % 1000) / 1000.0 < local_250)))) {
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)this,iVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              std::ostream::operator<<((ostream *)poVar8,iVar2);
              if ((uVar10 & 1) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>(this," ",1);
                iVar4 = rand();
                std::ostream::_M_insert<double>((double)(iVar4 % 100) / 100.0 + 1.0);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1);
              std::ostream::put(cVar1);
              std::ostream::flush();
            }
            iVar3 = iVar3 + 1;
          } while (iVar9 != iVar3);
        }
        iVar2 = (int)local_248;
      } while ((int)local_248 != iVar9);
    }
    pcVar11 = local_240;
    if (local_240 != (char *)0x0) {
      std::ofstream::close();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Wrote directed graph to ",0x18);
      sVar6 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + _VTT[-3] + -8) = _time;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return 0;
  }
LAB_001029c8:
  print_usage_and_exit(-1);
  std::ofstream::~ofstream(&local_230);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char** argv) {

	const char* filename = nullptr;
	int n = -1;
	float density = 1.0;
	bool edge_filtration = false;
	bool undirected = false;

	for (int i = 0; i < argc; ++i) {
		const std::string arg(argv[i]);
		if (arg == "--help") {
			print_usage_and_exit(0);
		} else if (arg == "--density") {
			density = float(atof(argv[++i]));
		} else if (arg == "--random-edge-filtration") {
			edge_filtration = true;
		} else if (arg == "--undirected") {
			undirected = true;
		} else {
			if (n > -1) {
				filename = argv[i];
			} else
				n = atoi(argv[i]);
		}
	}

	if (n == -1) { print_usage_and_exit(-1); }

	std::ofstream file_stream(filename);
	if (filename && file_stream.fail()) {
		std::cerr << "couldn't open file " << filename << std::endl;
		exit(-1);
	}

	srand((unsigned int)time(NULL));
	std::ostream& output_stream = filename ? file_stream : std::cout;
	output_stream << "dim 0" << std::endl;
	for (int i = 0; i < n; i++) output_stream << 0 << " ";
	output_stream << std::endl;

	output_stream << "dim 1" << std::endl;
	for (int i = 0; i < n; i++) {
		for (int j = i + 1; j < n; j++) {
			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << i << " " << j;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}

			if (undirected) continue;

			if (density == 1 || (rand() % 1000) / 1000.0 < density) {
				output_stream << j << " " << i;
				if (edge_filtration) output_stream << " " << (1 + (rand() % 100) / 100.0);
				output_stream << std::endl;
			}
		}
	}

	if (filename) {
		file_stream.close();
		std::cout << "Wrote directed graph to " << filename << "." << std::endl;
	}
}